

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

string * __thiscall
despot::ParticleBelief::text_abi_cxx11_(string *__return_storage_ptr__,ParticleBelief *this)

{
  double dVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppSVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  reference pvVar7;
  void *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *m;
  undefined1 local_270 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double> pair
  ;
  undefined1 local_240 [4];
  int i_1;
  undefined1 local_210 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  pairs;
  key_type local_1e8;
  int local_1c4;
  undefined1 local_1c0 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  pdf;
  ostringstream oss;
  ParticleBelief *this_local;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&pdf._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_1c0);
  local_1c4 = 0;
  while( true ) {
    uVar2 = (ulong)local_1c4;
    sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    if (sVar3 <= uVar2) break;
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)local_1c4);
    dVar1 = (*ppSVar4)->weight;
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)local_1c4);
    (*(*ppSVar4)->_vptr_State[2])(&local_1e8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)local_1c0,&local_1e8);
    *pmVar5 = dVar1 + *pmVar5;
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1c4 = local_1c4 + 1;
  }
  poVar6 = std::operator<<((ostream *)&pdf._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           "pdf for ");
  sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar3);
  poVar6 = std::operator<<(poVar6," particles:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_240,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_1c0);
  SortByValue<std::__cxx11::string,double>
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_210,(despot *)local_240,m);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_240);
  pair.second._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)pair.second._4_4_;
    sVar3 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)local_210);
    if (sVar3 <= uVar2) break;
    pvVar7 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)local_210,(long)pair.second._4_4_);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          *)local_270,pvVar7);
    poVar6 = std::operator<<((ostream *)&pdf._M_t._M_impl.super__Rb_tree_header._M_node_count," ");
    poVar6 = std::operator<<(poVar6,(string *)local_270);
    poVar6 = std::operator<<(poVar6," = ");
    this_00 = (void *)std::ostream::operator<<(poVar6,(double)pair.first.field_2._8_8_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *)local_270);
    pair.second._4_4_ = pair.second._4_4_ + 1;
  }
  std::__cxx11::ostringstream::str();
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *)local_210);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&pdf._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

string ParticleBelief::text() const {
	ostringstream oss;
	map<string, double> pdf;
	for (int i = 0; i < particles_.size(); i++) {
		pdf[particles_[i]->text()] += particles_[i]->weight;
	}

	oss << "pdf for " << particles_.size() << " particles:" << endl;
	vector<pair<string, double> > pairs = SortByValue(pdf);
	for (int i = 0; i < pairs.size(); i++) {
		pair<string, double> pair = pairs[i];
		oss << " " << pair.first << " = " << pair.second << endl;
	}
	return oss.str();
}